

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O2

void outputChar(char c,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = *outIx;
  uVar2 = (ulong)iVar1;
  if (uVar2 != 0) {
    if (c == '\0') goto LAB_001b6b7b;
    if (c == '\n') {
      if (iVar1 < capacity) goto LAB_001b6b7b;
    }
    else if (iVar1 < capacity) {
      if (outBuf[uVar2 - 1] != '\n') goto LAB_001b6b7b;
    }
    else if (c != '\n' || iVar1 < capacity) goto LAB_001b6b7b;
  }
  iVar3 = 0;
  if (0 < indent) {
    iVar3 = indent;
  }
  while( true ) {
    iVar1 = (int)uVar2;
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    if (iVar1 < capacity) {
      outBuf[iVar1] = ' ';
      iVar1 = *outIx;
    }
    uVar2 = (ulong)(iVar1 + 1U);
    *outIx = iVar1 + 1U;
  }
LAB_001b6b7b:
  if (iVar1 < capacity) {
    outBuf[iVar1] = c;
  }
  if (c != '\0') {
    *outIx = *outIx + 1;
  }
  return;
}

Assistant:

static void outputChar(char c, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i;
    /* Check whether a start of line indenting is needed.  Three cases:
     *   1.  At the start of the first line  (output index == 0).
     *   2.  At the start of subsequent lines  (preceeding char in buffer == '\n')
     *   3.  When preflighting buffer len (buffer capacity is exceeded), when
     *       a \n is output.  Ideally we wouldn't do the indent until the following char
     *       is received, but that won't work because there's no place to remember that
     *       the preceding char was \n.  Meaning that we may overstimate the
     *       buffer size needed.  No harm done.
     */
    if (*outIx==0 ||   /* case 1. */
        (c!='\n' && c!=0 && *outIx < capacity && outBuf[(*outIx)-1]=='\n') ||  /* case 2. */
        (c=='\n' && *outIx>=capacity))    /* case 3 */
    {
        /* At the start of a line.  Indent. */
        for(i=0; i<indent; i++) {
            if (*outIx < capacity) {
                outBuf[*outIx] = ' ';
            }
            (*outIx)++;
        }
    }

    if (*outIx < capacity) {
        outBuf[*outIx] = c;
    }
    if (c != 0) {
        /* Nulls only appear as end-of-string terminators.  Move them to the output
         *  buffer, but do not update the length of the buffer, so that any
         *  following output will overwrite the null. */
        (*outIx)++;
    }
}